

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::merl::merl(merl *this,char *path_to_file)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  exc *peVar3;
  reference pvVar4;
  int local_244;
  int local_240;
  int32_t dims [3];
  int32_t n;
  char local_228 [8];
  fstream f;
  char *path_to_file_local;
  merl *this_local;
  
  brdf_rgb::brdf_rgb(&this->super_brdf_rgb);
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00265df0;
  std::vector<double,_std::allocator<double>_>::vector(&this->m_samples);
  _Var2 = std::operator|(_S_in,_S_bin);
  std::fstream::fstream(local_228,path_to_file,_Var2);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    peVar3 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(peVar3,"djb_error: Failed to open %s\n",path_to_file);
    __cxa_throw(peVar3,&exc::typeinfo,exc::~exc);
  }
  std::istream::read(local_228,(long)&local_244);
  dims[1] = local_244 * local_240 * dims[0];
  if (dims[1] < 1) {
    peVar3 = (exc *)__cxa_allocate_exception(0x28);
    exc::exc(peVar3,"djb_error: Failed to read MERL header\n");
    __cxa_throw(peVar3,&exc::typeinfo,exc::~exc);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->m_samples,(long)(dims[1] * 3));
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_samples,0);
  std::istream::read(local_228,(long)pvVar4);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::fstream::~fstream(local_228);
    return;
  }
  peVar3 = (exc *)__cxa_allocate_exception(0x28);
  exc::exc(peVar3,"djb_error: Reading %s failed\n",path_to_file);
  __cxa_throw(peVar3,&exc::typeinfo,exc::~exc);
}

Assistant:

merl::merl(const char *path_to_file)
{
	std::fstream f(path_to_file, std::fstream::in | std::fstream::binary);
	int32_t n, dims[3];

	// check file
	if (!f.is_open())
		throw exc("djb_error: Failed to open %s\n", path_to_file);

	// read header
	f.read((char *)dims, /*bytes*/4 * 3);
	n = dims[0] * dims[1] * dims[2];
	if (n <= 0)
		throw exc("djb_error: Failed to read MERL header\n");

	// allocate brdf and read data
	m_samples.resize(3 * n);
	f.read((char *)&m_samples[0], sizeof(double) * 3 * n);
	if (f.fail())
		throw exc("djb_error: Reading %s failed\n", path_to_file);
}